

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O1

int Abc_Abc_NodeResubCollectDivs(Abc_ManRst_t *p,Abc_Obj_t *pRoot,Cut_Cut_t *pCut)

{
  uint uVar1;
  undefined4 uVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  int *piVar8;
  void **ppvVar9;
  int iVar10;
  Vec_Ptr_t *extraout_RDX;
  Vec_Ptr_t *extraout_RDX_00;
  Vec_Ptr_t *extraout_RDX_01;
  Vec_Ptr_t *extraout_RDX_02;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  
  p->vDecs->nSize = 0;
  pAVar3 = pRoot->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar15 = pAVar3->vObjs->nSize;
    uVar13 = (long)iVar15 + 500;
    iVar10 = (int)uVar13;
    if ((pAVar3->vTravIds).nCap < iVar10) {
      piVar8 = (int *)malloc(uVar13 * 4);
      (pAVar3->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar10;
    }
    if (-500 < iVar15) {
      memset((pAVar3->vTravIds).pArray,0,(uVar13 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar10;
  }
  iVar15 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar15 + 1;
  if (0x3ffffffe < iVar15) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  if (0xfffffff < *(uint *)pCut) {
    uVar13 = 0;
    do {
      iVar15 = *(int *)(&pCut[1].field_0x0 + uVar13 * 4);
      if (((long)iVar15 < 0) || (pVVar11 = pRoot->pNtk->vObjs, pVVar11->nSize <= iVar15)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar4 = (long *)pVVar11->pArray[iVar15];
      if (plVar4 == (long *)0x0) {
        return 0;
      }
      pVVar11 = p->vDecs;
      uVar1 = pVVar11->nCap;
      if (pVVar11->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar11->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar11->pArray,0x80);
          }
          pVVar11->pArray = ppvVar9;
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar1 * 2;
          if (iVar15 <= (int)uVar1) goto LAB_002957cf;
          if (pVVar11->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar11->pArray,(ulong)uVar1 << 4);
          }
          pVVar11->pArray = ppvVar9;
        }
        pVVar11->nCap = iVar15;
      }
LAB_002957cf:
      iVar15 = pVVar11->nSize;
      iVar10 = iVar15 + 1;
      pVVar11->nSize = iVar10;
      pVVar11->pArray[iVar15] = plVar4;
      lVar12 = *plVar4;
      uVar2 = *(undefined4 *)(lVar12 + 0xd8);
      iVar15 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar15 + 1,iVar10);
      if (((long)iVar15 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar15)) {
LAB_00295aaa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar12 + 0xe8) + (long)iVar15 * 4) = uVar2;
      uVar13 = uVar13 + 1;
    } while (uVar13 < *(uint *)pCut >> 0x1c);
  }
  pVVar11 = p->vDecs;
  if (0 < pVVar11->nSize) {
    lVar12 = 0;
    do {
      plVar4 = (long *)pVVar11->pArray[lVar12];
      if (0 < *(int *)((long)plVar4 + 0x2c)) {
        lVar14 = 0;
        do {
          plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                             (long)*(int *)(plVar4[6] + lVar14 * 4) * 8);
          lVar6 = *plVar5;
          iVar15 = (int)plVar5[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar15 + 1,(int)pVVar11);
          if (((long)iVar15 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar15)) {
LAB_00295a8b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pVVar11 = extraout_RDX;
          if ((*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar15 * 4) != *(int *)(*plVar5 + 0xd8)) &&
             ((*(uint *)((long)plVar5 + 0x14) & 0xf) != 3)) {
            plVar7 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)plVar5[4] * 8);
            lVar6 = *plVar7;
            iVar15 = (int)plVar7[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar15 + 1,(int)extraout_RDX);
            if (((long)iVar15 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar15)) goto LAB_00295a8b;
            pVVar11 = extraout_RDX_00;
            if (*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar15 * 4) == *(int *)(*plVar7 + 0xd8)) {
              plVar7 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                 (long)*(int *)(plVar5[4] + 4) * 8);
              lVar6 = *plVar7;
              iVar15 = (int)plVar7[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar15 + 1,(int)extraout_RDX_00);
              if (((long)iVar15 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar15)) goto LAB_00295a8b;
              pVVar11 = extraout_RDX_01;
              if (*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar15 * 4) == *(int *)(*plVar7 + 0xd8))
              {
                pVVar11 = p->vDecs;
                uVar1 = pVVar11->nCap;
                if (pVVar11->nSize == uVar1) {
                  if ((int)uVar1 < 0x10) {
                    if (pVVar11->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar11->pArray,0x80);
                    }
                    pVVar11->pArray = ppvVar9;
                    iVar15 = 0x10;
                  }
                  else {
                    iVar15 = uVar1 * 2;
                    if (iVar15 <= (int)uVar1) goto LAB_002959fc;
                    if (pVVar11->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar11->pArray,(ulong)uVar1 << 4);
                    }
                    pVVar11->pArray = ppvVar9;
                  }
                  pVVar11->nCap = iVar15;
                }
LAB_002959fc:
                iVar15 = pVVar11->nSize;
                iVar10 = iVar15 + 1;
                pVVar11->nSize = iVar10;
                pVVar11->pArray[iVar15] = plVar5;
                lVar6 = *plVar5;
                uVar2 = *(undefined4 *)(lVar6 + 0xd8);
                iVar15 = (int)plVar5[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar15 + 1,iVar10);
                if (((long)iVar15 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar15)) goto LAB_00295aaa;
                *(undefined4 *)(*(long *)(lVar6 + 0xe8) + (long)iVar15 * 4) = uVar2;
                pVVar11 = extraout_RDX_02;
              }
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)((long)plVar4 + 0x2c));
      }
      lVar12 = lVar12 + 1;
      pVVar11 = p->vDecs;
    } while (lVar12 < pVVar11->nSize);
  }
  return 1;
}

Assistant:

int Abc_Abc_NodeResubCollectDivs( Abc_ManRst_t * p, Abc_Obj_t * pRoot, Cut_Cut_t * pCut )
{
    Abc_Obj_t * pNode, * pFanout;
    int i, k;
    // collect the leaves of the cut
    Vec_PtrClear( p->vDecs );
    Abc_NtkIncrementTravId( pRoot->pNtk );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
    {
        pNode = Abc_NtkObj(pRoot->pNtk, pCut->pLeaves[i]);
        if ( pNode == NULL )  // the so-called "bad cut phenomenon" is due to removed nodes
            return 0;
        Vec_PtrPush( p->vDecs, pNode );
        Abc_NodeSetTravIdCurrent( pNode );        
    }
    // explore the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
    {
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanout) || Abc_ObjIsPo(pFanout) )
                continue;
            if ( Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pFanout)) && Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pFanout)) )
            {
                Vec_PtrPush( p->vDecs, pFanout );
                Abc_NodeSetTravIdCurrent( pFanout );     
            }
        }
    }
    return 1;
}